

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O0

void __thiscall
helics::apps::PhasorGenerator::setString
          (PhasorGenerator *this,string_view parameter,string_view val)

{
  string_view sVar1;
  string_view sVar2;
  complex<double> val_00;
  string_view parameter_00;
  size_t in_RCX;
  PhasorGenerator *in_RDX;
  size_t in_RSI;
  SignalGenerator *in_RDI;
  char *in_R8;
  size_t extraout_XMM0_Qa;
  double dVar3;
  char *in_XMM1_Qa;
  complex<double> valc;
  undefined1 in_stack_00000158 [16];
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  
  sVar4 = in_RCX;
  pcVar5 = in_R8;
  helicsGetComplex((string_view)in_stack_00000158);
  sVar6 = extraout_XMM0_Qa;
  dVar3 = std::abs<double>((complex<double> *)in_RDI);
  if (1000000000000.0 <= dVar3) {
    sVar2._M_str = (char *)in_RDX;
    sVar2._M_len = in_RSI;
    sVar1._M_str = in_R8;
    sVar1._M_len = in_RCX;
    SignalGenerator::setString(in_RDI,sVar2,sVar1);
  }
  else {
    parameter_00._M_str = in_XMM1_Qa;
    parameter_00._M_len = sVar6;
    val_00._M_value._8_8_ = pcVar5;
    val_00._M_value._0_8_ = sVar4;
    set(in_RDX,parameter_00,val_00);
  }
  return;
}

Assistant:

void PhasorGenerator::setString(std::string_view parameter, std::string_view val)
    {
        auto valc = helicsGetComplex(val);
        if (std::abs(valc) < 1e12) {
            set(parameter, valc);
        } else {
            SignalGenerator::setString(parameter, val);
        }
    }